

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

void __thiscall tinyusdz::Prim::Prim(Prim *this,Value *rhs)

{
  bool bVar1;
  uint32_t uVar2;
  value_type *pvVar3;
  Value *v;
  allocator local_251;
  string local_250;
  Path local_230;
  allocator local_159;
  string local_158;
  Path local_138;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_40 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pv;
  Value *rhs_local;
  Prim *this_local;
  
  pv.contained._24_8_ = rhs;
  Path::Path(&this->_abs_path);
  Path::Path(&this->_path);
  Path::Path(&this->_elementPath);
  std::__cxx11::string::string((string *)&this->_prim_type_name);
  this->_specifier = Invalid;
  tinyusdz::value::Value::Value(&this->_data);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::vector(&this->_children);
  std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::multiset(&this->_childrenNameSet);
  this->_child_dirty = false;
  this->_primChildrenIndicesIsValid = false;
  std::vector<long,_std::allocator<long>_>::vector(&this->_primChildrenIndices);
  this->_prim_id = -1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  ::map(&this->_variantSets);
  uVar2 = tinyusdz::value::Value::type_id((Value *)pv.contained._24_8_);
  if ((0x3ff < uVar2) &&
     (uVar2 = tinyusdz::value::Value::type_id((Value *)pv.contained._24_8_), uVar2 < 0x2006)) {
    GetPrimElementName_abi_cxx11_(&local_68,(tinyusdz *)pv.contained._24_8_,v);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_40,&local_68);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional(&local_68);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_40);
    if (bVar1) {
      pvVar3 = nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_158,"",&local_159);
      Path::Path(&local_138,pvVar3,&local_158);
      Path::operator=(&this->_path,&local_138);
      Path::~Path(&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      pvVar3 = nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_250,"",&local_251);
      Path::Path(&local_230,pvVar3,&local_250);
      Path::operator=(&this->_elementPath,&local_230);
      Path::~Path(&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
    }
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_40);
    tinyusdz::value::Value::operator=(&this->_data,(Value *)pv.contained._24_8_);
  }
  return;
}

Assistant:

Prim::Prim(const value::Value &rhs) {
  // Check if type is Prim(Model(GPrim), usdShade, usdLux, etc.)
  if ((value::TypeId::TYPE_ID_MODEL_BEGIN <= rhs.type_id()) &&
      (value::TypeId::TYPE_ID_MODEL_END > rhs.type_id())) {
    if (auto pv = GetPrimElementName(rhs)) {
      _path = Path(pv.value(), /* prop part*/ "");
      _elementPath = Path(pv.value(), /* prop part */ "");
    }

    _data = rhs;
  } else {
    // TODO: Raise an error if rhs is not an Prim
  }
}